

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void prepare_marching_ants_shader(Uint32 shader,GPU_Target *screen,GPU_Image *image)

{
  int iVar1;
  
  if (image != (GPU_Image *)0x0) {
    iVar1 = GPU_GetUniformLocation(shader,"resolution_x");
    GPU_SetUniformf(iVar1,(float)image->w);
    iVar1 = GPU_GetUniformLocation(shader,"resolution_y");
    GPU_SetUniformf(iVar1,(float)image->h);
  }
  iVar1 = GPU_GetUniformLocation(shader,"screen_w");
  GPU_SetUniformf(iVar1,(float)screen->w);
  iVar1 = GPU_GetUniformLocation(shader,"screen_h");
  GPU_SetUniformf(iVar1,(float)screen->h);
  iVar1 = GPU_GetUniformLocation(shader,"zoom");
  GPU_SetUniformf(iVar1,1.0);
  return;
}

Assistant:

void prepare_marching_ants_shader(Uint32 shader, GPU_Target* screen, GPU_Image* image)
{
    if(image != NULL)
    {
        GPU_SetUniformf(GPU_GetUniformLocation(shader, "resolution_x"), image->w);
        GPU_SetUniformf(GPU_GetUniformLocation(shader, "resolution_y"), image->h);
    }
    GPU_SetUniformf(GPU_GetUniformLocation(shader, "screen_w"), screen->w);
    GPU_SetUniformf(GPU_GetUniformLocation(shader, "screen_h"), screen->h);
    GPU_SetUniformf(GPU_GetUniformLocation(shader, "zoom"), 1.0f);
}